

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O2

int __thiscall boost::filesystem::detail::remove(detail *this,char *__filename)

{
  bool bVar1;
  file_type type;
  undefined7 extraout_var;
  err_t error_num;
  int iVar2;
  error_code tmp_ec;
  error_code local_30;
  
  local_30.m_val = 0;
  local_30.m_cat = system::system_category();
  type = anon_unknown.dwarf_54f5::query_file_type((path *)this,&local_30);
  iVar2 = 0;
  error_num = 0;
  if (type == status_error) {
    error_num = local_30.m_val;
  }
  bVar1 = anon_unknown.dwarf_54f5::error
                    (error_num,(path *)this,(error_code *)__filename,"boost::filesystem::remove");
  if (!bVar1) {
    bVar1 = anon_unknown.dwarf_54f5::remove_file_or_directory
                      ((path *)this,type,(error_code *)__filename);
    iVar2 = (int)CONCAT71(extraout_var,bVar1);
  }
  return iVar2;
}

Assistant:

BOOST_FILESYSTEM_DECL
  bool remove(const path& p, error_code* ec)
  {
    error_code tmp_ec;
    file_type type = query_file_type(p, &tmp_ec);
    if (error(type == status_error ? tmp_ec.value() : 0, p, ec,
        "boost::filesystem::remove"))
      return false;

    // Since POSIX remove() is specified to work with either files or directories, in a
    // perfect world it could just be called. But some important real-world operating
    // systems (Windows, Mac OS X, for example) don't implement the POSIX spec. So
    // remove_file_or_directory() is always called to keep it simple.
    return remove_file_or_directory(p, type, ec);
  }